

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvector.cpp
# Opt level: O3

UBool __thiscall icu_63::UVector::containsAll(UVector *this,UVector *other)

{
  int32_t iVar1;
  long lVar2;
  
  if (other->count < 1) {
    return '\x01';
  }
  lVar2 = 0;
  do {
    iVar1 = indexOf(this,other->elements[lVar2],0,'\0');
    if (iVar1 < 0) break;
    lVar2 = lVar2 + 1;
  } while (lVar2 < other->count);
  return -1 < iVar1;
}

Assistant:

UBool UVector::containsAll(const UVector& other) const {
    for (int32_t i=0; i<other.size(); ++i) {
        if (indexOf(other.elements[i]) < 0) {
            return FALSE;
        }
    }
    return TRUE;
}